

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlFreeValidCtxt(xmlValidCtxtPtr cur)

{
  xmlValidCtxtPtr cur_local;
  
  if (cur != (xmlValidCtxtPtr)0x0) {
    if (cur->vstateTab != (xmlValidState *)0x0) {
      (*xmlFree)(cur->vstateTab);
    }
    if (cur->nodeTab != (xmlNodePtr *)0x0) {
      (*xmlFree)(cur->nodeTab);
    }
    (*xmlFree)(cur);
  }
  return;
}

Assistant:

void
xmlFreeValidCtxt(xmlValidCtxtPtr cur) {
    if (cur == NULL)
        return;
    if (cur->vstateTab != NULL)
        xmlFree(cur->vstateTab);
    if (cur->nodeTab != NULL)
        xmlFree(cur->nodeTab);
    xmlFree(cur);
}